

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O0

void __thiscall
ExternalFixupMembersImport_IsWeak_Test::ExternalFixupMembersImport_IsWeak_Test
          (ExternalFixupMembersImport_IsWeak_Test *this)

{
  ExternalFixupMembersImport_IsWeak_Test *this_local;
  
  anon_unknown.dwarf_33b920::ExternalFixupMembersImport::ExternalFixupMembersImport
            (&this->super_ExternalFixupMembersImport);
  (this->super_ExternalFixupMembersImport).super_Test._vptr_Test =
       (_func_int **)&PTR__ExternalFixupMembersImport_IsWeak_Test_003f4c28;
  return;
}

Assistant:

TEST_F (ExternalFixupMembersImport, IsWeak) {
    mock_mutex mutex;
    auto transaction = begin (db_, transaction_lock{mutex});

    pstore::exchange::import_ns::string_mapping imported_names;
    // Add a single name with index 0.
    ASSERT_EQ (imported_names.add_string (&transaction, "name"), std::error_code{});

    // The is_weak key is missing altogether. That's okay: the default is 'false'.
    {
        auto const & parser1 = this->parse (R"({ "name":0, "type":17, "offset":19, "addend":23 })",
                                            &db_, imported_names);
        EXPECT_FALSE (parser1.has_error ())
            << "JSON error was: " << parser1.last_error ().message ();
    }
    // The is_weak key has the wrong type.
    {
        auto const & parser2 =
            this->parse (R"({ "name":0, "type":true, "is_weak":0, offset":19, "addend":23 })", &db_,
                         imported_names);
        ASSERT_TRUE (parser2.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser2.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
    }
}